

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateStatePdu.cpp
# Opt level: O2

void __thiscall DIS::AggregateStatePdu::marshal(AggregateStatePdu *this,DataStream *dataStream)

{
  pointer pAVar1;
  pointer pEVar2;
  pointer pEVar3;
  pointer pVVar4;
  size_t idx;
  ulong uVar5;
  size_t idx_1;
  long lVar6;
  AggregateID x;
  
  EntityManagementFamilyPdu::marshal(&this->super_EntityManagementFamilyPdu,dataStream);
  EntityID::marshal(&this->_aggregateID,dataStream);
  DataStream::operator<<(dataStream,this->_forceID);
  DataStream::operator<<(dataStream,this->_aggregateState);
  EntityType::marshal(&this->_aggregateType,dataStream);
  DataStream::operator<<(dataStream,this->_formation);
  AggregateMarking::marshal(&this->_aggregateMarking,dataStream);
  Vector3Float::marshal(&this->_dimensions,dataStream);
  Orientation::marshal(&this->_orientation,dataStream);
  Vector3Double::marshal(&this->_centerOfMass,dataStream);
  Vector3Float::marshal(&this->_velocity,dataStream);
  DataStream::operator<<
            (dataStream,
             (unsigned_short)
             ((uint)(*(int *)&(this->_aggregateIDList).
                              super__Vector_base<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                    *(int *)&(this->_aggregateIDList).
                             super__Vector_base<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4));
  DataStream::operator<<
            (dataStream,
             (unsigned_short)
             ((uint)(*(int *)&(this->_entityIDList).
                              super__Vector_base<DIS::EntityID,_std::allocator<DIS::EntityID>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                    *(int *)&(this->_entityIDList).
                             super__Vector_base<DIS::EntityID,_std::allocator<DIS::EntityID>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 4));
  DataStream::operator<<
            (dataStream,
             (unsigned_short)
             ((uint)(*(int *)&(this->_silentAggregateSystemList).
                              super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                    *(int *)&(this->_silentAggregateSystemList).
                             super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 4));
  DataStream::operator<<
            (dataStream,
             (unsigned_short)
             ((uint)(*(int *)&(this->_silentEntitySystemList).
                              super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                    *(int *)&(this->_silentEntitySystemList).
                             super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>.
                             _M_impl.super__Vector_impl_data._M_start) >> 4));
  lVar6 = 8;
  for (uVar5 = 0;
      pAVar1 = (this->_aggregateIDList).
               super__Vector_base<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->_aggregateIDList).
                            super__Vector_base<DIS::AggregateID,_std::allocator<DIS::AggregateID>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pAVar1 >> 4);
      uVar5 = uVar5 + 1) {
    x._vptr_AggregateID = (_func_int **)&PTR__AggregateID_001b0338;
    x._aggregateID = *(undefined2 *)((long)&pAVar1->_vptr_AggregateID + lVar6 + 4);
    x._8_4_ = *(undefined4 *)((long)&pAVar1->_vptr_AggregateID + lVar6);
    AggregateID::marshal(&x,dataStream);
    AggregateID::~AggregateID(&x);
    lVar6 = lVar6 + 0x10;
  }
  lVar6 = 8;
  for (uVar5 = 0;
      pEVar2 = (this->_entityIDList).
               super__Vector_base<DIS::EntityID,_std::allocator<DIS::EntityID>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->_entityIDList).
                            super__Vector_base<DIS::EntityID,_std::allocator<DIS::EntityID>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pEVar2 >> 4);
      uVar5 = uVar5 + 1) {
    x._vptr_AggregateID = (_func_int **)&PTR__EntityID_001b0cb8;
    x._aggregateID = *(undefined2 *)((long)&pEVar2->_vptr_EntityID + lVar6 + 4);
    x._8_4_ = *(undefined4 *)((long)&pEVar2->_vptr_EntityID + lVar6);
    EntityID::marshal((EntityID *)&x,dataStream);
    EntityID::~EntityID((EntityID *)&x);
    lVar6 = lVar6 + 0x10;
  }
  DataStream::operator<<(dataStream,this->_pad2);
  lVar6 = 8;
  for (uVar5 = 0;
      pEVar3 = (this->_silentAggregateSystemList).
               super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->_silentAggregateSystemList).
                            super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pEVar3 >> 4);
      uVar5 = uVar5 + 1) {
    x._vptr_AggregateID = (_func_int **)&PTR__EntityType_001b0e40;
    x._8_8_ = *(undefined8 *)((long)&pEVar3->_vptr_EntityType + lVar6);
    EntityType::marshal((EntityType *)&x,dataStream);
    EntityType::~EntityType((EntityType *)&x);
    lVar6 = lVar6 + 0x10;
  }
  lVar6 = 8;
  for (uVar5 = 0;
      pEVar3 = (this->_silentEntitySystemList).
               super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->_silentEntitySystemList).
                            super__Vector_base<DIS::EntityType,_std::allocator<DIS::EntityType>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pEVar3 >> 4);
      uVar5 = uVar5 + 1) {
    x._vptr_AggregateID = (_func_int **)&PTR__EntityType_001b0e40;
    x._8_8_ = *(undefined8 *)((long)&pEVar3->_vptr_EntityType + lVar6);
    EntityType::marshal((EntityType *)&x,dataStream);
    EntityType::~EntityType((EntityType *)&x);
    lVar6 = lVar6 + 0x10;
  }
  DataStream::operator<<
            (dataStream,
             (uint)(((long)(this->_variableDatumList).
                           super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->_variableDatumList).
                          super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x30));
  lVar6 = 0;
  for (uVar5 = 0;
      pVVar4 = (this->_variableDatumList).
               super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>._M_impl.
               super__Vector_impl_data._M_start,
      uVar5 < (ulong)(((long)(this->_variableDatumList).
                             super__Vector_base<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar4) / 0x30);
      uVar5 = uVar5 + 1) {
    VariableDatum::VariableDatum
              ((VariableDatum *)&x,(VariableDatum *)((long)&pVVar4->_vptr_VariableDatum + lVar6));
    VariableDatum::marshal((VariableDatum *)&x,dataStream);
    VariableDatum::~VariableDatum((VariableDatum *)&x);
    lVar6 = lVar6 + 0x30;
  }
  return;
}

Assistant:

void AggregateStatePdu::marshal(DataStream& dataStream) const
{
    EntityManagementFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _aggregateID.marshal(dataStream);
    dataStream << _forceID;
    dataStream << _aggregateState;
    _aggregateType.marshal(dataStream);
    dataStream << _formation;
    _aggregateMarking.marshal(dataStream);
    _dimensions.marshal(dataStream);
    _orientation.marshal(dataStream);
    _centerOfMass.marshal(dataStream);
    _velocity.marshal(dataStream);
    dataStream << ( unsigned short )_aggregateIDList.size();
    dataStream << ( unsigned short )_entityIDList.size();
    dataStream << ( unsigned short )_silentAggregateSystemList.size();
    dataStream << ( unsigned short )_silentEntitySystemList.size();

     for(size_t idx = 0; idx < _aggregateIDList.size(); idx++)
     {
        AggregateID x = _aggregateIDList[idx];
        x.marshal(dataStream);
     }


     for(size_t idx = 0; idx < _entityIDList.size(); idx++)
     {
        EntityID x = _entityIDList[idx];
        x.marshal(dataStream);
     }

    dataStream << _pad2;

     for(size_t idx = 0; idx < _silentAggregateSystemList.size(); idx++)
     {
        EntityType x = _silentAggregateSystemList[idx];
        x.marshal(dataStream);
     }


     for(size_t idx = 0; idx < _silentEntitySystemList.size(); idx++)
     {
        EntityType x = _silentEntitySystemList[idx];
        x.marshal(dataStream);
     }

    dataStream << ( unsigned int )_variableDatumList.size();

     for(size_t idx = 0; idx < _variableDatumList.size(); idx++)
     {
        VariableDatum x = _variableDatumList[idx];
        x.marshal(dataStream);
     }

}